

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O3

bool QFileSystemEngine::setPermissions(int fd,Permissions permissions,QSystemError *error)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  uint uVar4;
  
  uVar1 = (uint)(((uint)permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                        super_QFlagsStorage<QFileDevice::Permission>.i & 0x4400) != 0) * 0x100;
  uVar4 = uVar1 + 0x80;
  if (((uint)permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
             super_QFlagsStorage<QFileDevice::Permission>.i & 0x2200) == 0) {
    uVar4 = uVar1;
  }
  uVar1 = uVar4 + 0x40;
  if (((uint)permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
             super_QFlagsStorage<QFileDevice::Permission>.i & 0x1100) == 0) {
    uVar1 = uVar4;
  }
  iVar2 = fchmod(fd,(uint)permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                          super_QFlagsStorage<QFileDevice::Permission>.i & 7 |
                    (uint)permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                          super_QFlagsStorage<QFileDevice::Permission>.i >> 1 & 0x38 | uVar1);
  if (iVar2 != 0) {
    puVar3 = (uint *)__errno_location();
    *error = (QSystemError)((ulong)*puVar3 | 0x100000000);
  }
  return iVar2 == 0;
}

Assistant:

bool QFileSystemEngine::setPermissions(int fd, QFile::Permissions permissions, QSystemError &error)
{
    mode_t mode = QtPrivate::toMode_t(permissions);
    bool success = ::fchmod(fd, mode) == 0;
    if (!success)
        error = QSystemError(errno, QSystemError::StandardLibraryError);
    return success;
}